

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool __thiscall
gflags::anon_unknown_2::FlagRegistry::SetFlagLocked
          (FlagRegistry *this,CommandLineFlag *flag,char *value,FlagSettingMode set_mode,string *msg
          )

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  string local_78;
  string local_58;
  string *local_38;
  string *msg_local;
  char *pcStack_28;
  FlagSettingMode set_mode_local;
  char *value_local;
  CommandLineFlag *flag_local;
  FlagRegistry *this_local;
  
  local_38 = msg;
  msg_local._4_4_ = set_mode;
  pcStack_28 = value;
  value_local = (char *)flag;
  flag_local = (CommandLineFlag *)this;
  CommandLineFlag::UpdateModifiedBit(flag);
  if (msg_local._4_4_ == SET_FLAGS_VALUE) {
    bVar1 = TryParseLocked((CommandLineFlag *)value_local,*(FlagValue **)(value_local + 0x28),
                           pcStack_28,local_38);
    if (!bVar1) {
      return false;
    }
    value_local[0x18] = '\x01';
  }
  else if (msg_local._4_4_ == SET_FLAG_IF_DEFAULT) {
    if ((value_local[0x18] & 1U) == 0) {
      bVar1 = TryParseLocked((CommandLineFlag *)value_local,*(FlagValue **)(value_local + 0x28),
                             pcStack_28,local_38);
      if (!bVar1) {
        return false;
      }
      value_local[0x18] = '\x01';
    }
    else {
      pcVar2 = CommandLineFlag::name((CommandLineFlag *)value_local);
      (anonymous_namespace)::CommandLineFlag::current_value_abi_cxx11_(&local_78,value_local);
      uVar3 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_(&local_58,"%s set to %s",pcVar2,uVar3);
      std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  else {
    if (msg_local._4_4_ != SET_FLAGS_DEFAULT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                    ,0x37b,
                    "bool gflags::(anonymous namespace)::FlagRegistry::SetFlagLocked(CommandLineFlag *, const char *, FlagSettingMode, string *)"
                   );
    }
    bVar1 = TryParseLocked((CommandLineFlag *)value_local,*(FlagValue **)(value_local + 0x20),
                           pcStack_28,local_38);
    if (!bVar1) {
      return false;
    }
    if ((value_local[0x18] & 1U) == 0) {
      TryParseLocked((CommandLineFlag *)value_local,*(FlagValue **)(value_local + 0x28),pcStack_28,
                     (string *)0x0);
    }
  }
  return true;
}

Assistant:

bool FlagRegistry::SetFlagLocked(CommandLineFlag* flag,
                                 const char* value,
                                 FlagSettingMode set_mode,
                                 string* msg) {
  flag->UpdateModifiedBit();
  switch (set_mode) {
    case SET_FLAGS_VALUE: {
      // set or modify the flag's value
      if (!TryParseLocked(flag, flag->current_, value, msg))
        return false;
      flag->modified_ = true;
      break;
    }
    case SET_FLAG_IF_DEFAULT: {
      // set the flag's value, but only if it hasn't been set by someone else
      if (!flag->modified_) {
        if (!TryParseLocked(flag, flag->current_, value, msg))
          return false;
        flag->modified_ = true;
      } else {
        *msg = StringPrintf("%s set to %s",
                            flag->name(), flag->current_value().c_str());
      }
      break;
    }
    case SET_FLAGS_DEFAULT: {
      // modify the flag's default-value
      if (!TryParseLocked(flag, flag->defvalue_, value, msg))
        return false;
      if (!flag->modified_) {
        // Need to set both defvalue *and* current, in this case
        TryParseLocked(flag, flag->current_, value, NULL);
      }
      break;
    }
    default: {
      // unknown set_mode
      assert(false);
      return false;
    }
  }

  return true;
}